

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpDblJA3(word *b,word *a,ec_o *ec,void *stack)

{
  bool_t bVar1;
  word *b_00;
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *t2;
  word *t1;
  size_t n;
  word *mod;
  word *b_01;
  
  mod = *(word **)(in_RDX[3] + 0x30);
  b_00 = (word *)(in_RCX + (long)mod * 8);
  b_01 = b_00 + (long)mod;
  bVar1 = wwIsZero(in_RSI + (long)mod * 2,*(size_t *)(in_RDX[3] + 0x30));
  if ((bVar1 == 0) &&
     (bVar1 = wwIsZero(in_RSI + (long)mod,*(size_t *)(in_RDX[3] + 0x30)), bVar1 == 0)) {
    (**(code **)(in_RDX[3] + 0x70))(in_RCX,in_RSI + (long)mod * 2,in_RDX[3],b_01);
    (**(code **)(in_RDX[3] + 0x68))
              (in_RDI + (long)mod * 2,in_RSI + (long)mod,in_RSI + (long)mod * 2,in_RDX[3],b_01);
    zzDoubleMod(t2,in_RDI,in_RSI,(size_t)in_RDX);
    zzSubMod(in_RSI,in_RDX,b_01,mod,in_RCX);
    zzAddMod(t2,in_RDI,in_RSI,in_RDX,(size_t)b_01);
    (**(code **)(in_RDX[3] + 0x68))(b_00,in_RCX,b_00,in_RDX[3],b_01);
    zzDoubleMod(t2,in_RDI,in_RSI,(size_t)in_RDX);
    zzAddMod(t2,in_RDI,in_RSI,in_RDX,(size_t)b_01);
    zzDoubleMod(t2,in_RDI,in_RSI,(size_t)in_RDX);
    (**(code **)(in_RDX[3] + 0x70))(in_RDI + (long)mod,in_RDI + (long)mod,in_RDX[3],b_01);
    (**(code **)(in_RDX[3] + 0x70))(b_00,in_RDI + (long)mod,in_RDX[3],b_01);
    zzHalfMod(b_00,b_00,*(word **)(in_RDX[3] + 0x18),*(size_t *)(in_RDX[3] + 0x30));
    (**(code **)(in_RDX[3] + 0x68))(in_RDI + (long)mod,in_RDI + (long)mod,in_RSI,in_RDX[3],b_01);
    (**(code **)(in_RDX[3] + 0x70))(in_RDI,in_RCX,in_RDX[3],b_01);
    zzSubMod(in_RSI,in_RDX,b_01,mod,in_RCX);
    zzSubMod(in_RSI,in_RDX,b_01,mod,in_RCX);
    zzSubMod(in_RSI,in_RDX,b_01,mod,in_RCX);
    (**(code **)(in_RDX[3] + 0x68))(in_RDI + (long)mod,in_RDI + (long)mod,in_RCX,in_RDX[3],b_01);
    zzSubMod(in_RSI,in_RDX,b_01,mod,in_RCX);
    return;
  }
  wwSetZero(in_RDI + (long)mod * 2,*(size_t *)(in_RDX[3] + 0x30));
  return;
}

Assistant:

static void ecpDblJA3(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// za == 0 или ya == 0? => b <- O
	if (qrIsZero(ecZ(a, n), ec->f) || qrIsZero(ecY(a, n), ec->f))
	{
		qrSetZero(ecZ(b, n), ec->f);
		return;
	}
	// t1 <- za^2
	qrSqr(t1, ecZ(a, n), ec->f, stack);
	// zb <- ya za
	qrMul(ecZ(b, n), ecY(a, n), ecZ(a, n), ec->f, stack);
	// zb <- 2 zb
	gfpDouble(ecZ(b, n), ecZ(b, n), ec->f);
	// t2 <- xa - t1
	zmSub(t2, ecX(a), t1, ec->f);
	// t1 <- xa + t1
	zmAdd(t1, ecX(a), t1, ec->f);
	// t2 <- t1 t2
	qrMul(t2, t1, t2, ec->f, stack);
	// t1 <- 2 t2
	gfpDouble(t1, t2, ec->f);
	// t1 <- t1 + t2
	zmAdd(t1, t1, t2, ec->f);
	// yb <- 2 ya
	gfpDouble(ecY(b, n), ecY(a, n), ec->f);
	// yb <- yb^2
	qrSqr(ecY(b, n), ecY(b, n), ec->f, stack);
	// t2 <- yb^2
	qrSqr(t2, ecY(b, n), ec->f, stack);
	// t2 <- t2 / 2
	gfpHalf(t2, t2, ec->f);
	// yb <- yb xa
	qrMul(ecY(b, n), ecY(b, n), ecX(a), ec->f, stack);
	// xb <- t1^2
	qrSqr(ecX(b), t1, ec->f, stack);
	// xb <- xb - yb
	zmSub(ecX(b), ecX(b), ecY(b, n), ec->f);
	// xb <- xb - yb
	zmSub(ecX(b), ecX(b), ecY(b, n), ec->f);
	// yb <- yb - xb
	zmSub(ecY(b, n), ecY(b, n), ecX(b), ec->f);
	// yb <- yb t1
	qrMul(ecY(b, n), ecY(b, n), t1, ec->f, stack);
	// yb <- yb - t2
	zmSub(ecY(b, n), ecY(b, n), t2, ec->f);
}